

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocalsocket_unix.cpp
# Opt level: O0

void __thiscall QLocalSocketPrivate::_q_connectToSocket(QLocalSocketPrivate *this)

{
  QLatin1StringView latin1;
  QLatin1StringView latin1_00;
  QLatin1StringView latin1_01;
  bool bVar1;
  int iVar2;
  QObject *pQVar3;
  parameter_type pQVar4;
  qsizetype qVar5;
  int *piVar6;
  QSocketNotifier *this_00;
  QTimer *this_01;
  QLocalSocketPrivate *in_RDI;
  long in_FS_OFFSET;
  socklen_t addrSize;
  uint extraCharacters;
  QLocalSocket *q;
  QString function_2;
  QString function_1;
  QString function;
  QByteArray encodedConnectingPathName;
  QString connectingPathName;
  SocketOptions options;
  sockaddr_un addr;
  QFlagsStorage<QLocalSocket::SocketOption> in_stack_fffffffffffffe48;
  SocketOption in_stack_fffffffffffffe4c;
  QString *in_stack_fffffffffffffe50;
  sockaddr *in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe60;
  int in_stack_fffffffffffffe64;
  undefined8 in_stack_fffffffffffffe68;
  LocalSocketError error;
  undefined1 *__dest;
  QLocalSocketPrivate *in_stack_fffffffffffffe70;
  char *in_stack_fffffffffffffe80;
  QFlagsStorage<QLocalSocket::SocketOption> options_00;
  undefined1 in_stack_fffffffffffffe90 [16];
  undefined1 in_stack_fffffffffffffea0 [16];
  undefined1 auVar7 [12];
  int iVar8;
  undefined4 in_stack_fffffffffffffeb4;
  QFlagsStorage<QIODeviceBase::OpenModeFlag> local_11c;
  undefined8 local_118;
  undefined8 local_110;
  undefined8 local_108;
  Int local_100;
  Int local_fc;
  Connection local_f8;
  Connection local_f0;
  undefined8 in_stack_ffffffffffffff18;
  QFlagsStorage<QIODeviceBase::OpenModeFlag> openMode;
  QByteArray local_b8;
  QFlagsStorageHelper<QLocalSocket::SocketOption,_4> local_9c;
  undefined8 local_98;
  undefined8 local_90;
  undefined8 local_88;
  Int local_80;
  Int local_7c;
  undefined2 local_76;
  undefined1 uStack_74;
  undefined1 auStack_73 [107];
  long local_8;
  
  openMode.i = (Int)((ulong)in_stack_ffffffffffffff18 >> 0x20);
  error = (LocalSocketError)((ulong)in_stack_fffffffffffffe68 >> 0x20);
  auVar7 = in_stack_fffffffffffffea0._4_12_;
  options_00.i = in_stack_fffffffffffffe90._4_4_;
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = (QObject *)q_func(in_RDI);
  local_7c = 0xaaaaaaaa;
  pQVar4 = QObjectBindableProperty::operator_cast_to_QFlags_
                     ((QObjectBindableProperty<QLocalSocketPrivate,_QFlags<QLocalSocket::SocketOption>,_&QLocalSocketPrivate::_qt_property_socketOptions_offset,_nullptr>
                       *)0x387dac);
  local_80 = (pQVar4->super_QFlagsStorageHelper<QLocalSocket::SocketOption,_4>).
             super_QFlagsStorage<QLocalSocket::SocketOption>.i;
  local_9c.super_QFlagsStorage<QLocalSocket::SocketOption>.i =
       (QFlagsStorage<QLocalSocket::SocketOption>)
       anon_unknown.dwarf_996a6b::optionsForPlatform((SocketOptions)in_stack_fffffffffffffe48.i);
  local_98 = 0xaaaaaaaaaaaaaaaa;
  local_90 = 0xaaaaaaaaaaaaaaaa;
  local_88 = 0xaaaaaaaaaaaaaaaa;
  local_7c = (Int)local_9c.super_QFlagsStorage<QLocalSocket::SocketOption>.i;
  anon_unknown.dwarf_996a6b::pathNameForConnection
            ((QString *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
             (SocketOptions)options_00.i);
  local_b8.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_b8.d.ptr = (char *)0xaaaaaaaaaaaaaaaa;
  local_b8.d.size = -0x5555555555555556;
  QFile::encodeName((QString *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48.i));
  memset(&local_76,0xaa,0x6e);
  local_76 = 1;
  memset(&uStack_74,0,0x6c);
  qVar5 = QByteArray::size(&local_b8);
  if (0x6c < qVar5 + 2U) {
    Qt::Literals::StringLiterals::operator____L1
              ((char *)in_stack_fffffffffffffe58,(size_t)in_stack_fffffffffffffe50);
    latin1.m_data = (char *)in_RDI;
    latin1.m_size = (qsizetype)in_stack_fffffffffffffe80;
    QString::QString((QString *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),latin1
                    );
    setErrorAndEmit(in_stack_fffffffffffffe70,error,
                    (QString *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
    QString::~QString((QString *)0x387f56);
    goto LAB_00388463;
  }
  iVar8 = 0x6e;
  bVar1 = QFlags<QLocalSocket::SocketOption>::testFlag
                    ((QFlags<QLocalSocket::SocketOption> *)in_stack_fffffffffffffe50,
                     in_stack_fffffffffffffe4c);
  if (bVar1) {
    in_stack_fffffffffffffe80 = QByteArray::constData((QByteArray *)0x387f9d);
    qVar5 = QByteArray::size(&local_b8);
    memcpy(auStack_73,in_stack_fffffffffffffe80,qVar5 + 1);
    qVar5 = QByteArray::size(&local_b8);
    iVar8 = (int)qVar5 + 3;
  }
  else {
    __dest = &uStack_74;
    in_stack_fffffffffffffe70 = (QLocalSocketPrivate *)QByteArray::constData((QByteArray *)0x387ffe)
    ;
    qVar5 = QByteArray::size(&local_b8);
    memcpy(__dest,in_stack_fffffffffffffe70,qVar5 + 1);
    error = (LocalSocketError)((ulong)__dest >> 0x20);
  }
  iVar2 = qt_safe_connect(in_stack_fffffffffffffe64,in_stack_fffffffffffffe58,
                          (socklen_t)((ulong)in_stack_fffffffffffffe50 >> 0x20));
  if (iVar2 != -1) {
    cancelDelayedConnect
              ((QLocalSocketPrivate *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60))
    ;
    QString::operator=(&in_RDI->serverName,(QString *)&in_RDI->connectingName);
    QString::operator=(&in_RDI->fullServerName,(QString *)&local_98);
    local_fc = (in_RDI->connectingOpenMode).
               super_QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4>.
               super_QFlagsStorage<QIODeviceBase::OpenModeFlag>.i;
    bVar1 = QAbstractSocket::setSocketDescriptor
                      ((QAbstractSocket *)CONCAT44(in_stack_fffffffffffffeb4,iVar8),auVar7._4_8_,
                       auVar7._0_4_,(OpenMode)openMode.i);
    if (bVar1) {
      local_100 = (in_RDI->connectingOpenMode).
                  super_QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4>.
                  super_QFlagsStorage<QIODeviceBase::OpenModeFlag>.i;
      QIODevice::open((QFlags_conflict *)pQVar3);
      QLocalSocket::connected((QLocalSocket *)0x388385);
    }
    else {
      local_118 = 0xaaaaaaaaaaaaaaaa;
      local_110 = 0xaaaaaaaaaaaaaaaa;
      local_108 = 0xaaaaaaaaaaaaaaaa;
      Qt::Literals::StringLiterals::operator____L1
                ((char *)in_stack_fffffffffffffe58,(size_t)in_stack_fffffffffffffe50);
      latin1_01.m_data = (char *)in_RDI;
      latin1_01.m_size = (qsizetype)in_stack_fffffffffffffe80;
      QString::QString((QString *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                       latin1_01);
      setErrorAndEmit(in_stack_fffffffffffffe70,error,
                      (QString *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
      QString::~QString((QString *)0x38840d);
    }
    in_RDI->connectingSocket = -1;
    QString::clear(in_stack_fffffffffffffe50);
    memset(&local_11c,0,4);
    QFlags<QIODeviceBase::OpenModeFlag>::QFlags((QFlags<QIODeviceBase::OpenModeFlag> *)0x388449);
    (in_RDI->connectingOpenMode).super_QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4>.
    super_QFlagsStorage<QIODeviceBase::OpenModeFlag>.i = local_11c.i;
    goto LAB_00388463;
  }
  Qt::Literals::StringLiterals::operator____L1
            ((char *)in_stack_fffffffffffffe58,(size_t)in_stack_fffffffffffffe50);
  latin1_00.m_data = (char *)in_RDI;
  latin1_00.m_size = (qsizetype)in_stack_fffffffffffffe80;
  QString::QString((QString *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                   latin1_00);
  piVar6 = __errno_location();
  iVar8 = *piVar6;
  if (iVar8 == 1) {
LAB_00388139:
    setErrorAndEmit(in_stack_fffffffffffffe70,error,
                    (QString *)CONCAT44(iVar8,in_stack_fffffffffffffe60));
  }
  else if (iVar8 == 2) {
    setErrorAndEmit(in_stack_fffffffffffffe70,error,(QString *)CONCAT44(2,in_stack_fffffffffffffe60)
                   );
  }
  else if (iVar8 == 0xb) {
    if (in_RDI->delayConnect == (QSocketNotifier *)0x0) {
      this_00 = (QSocketNotifier *)operator_new(0x10);
      QSocketNotifier::QSocketNotifier(this_00,(long)in_RDI->connectingSocket,Write,pQVar3);
      in_RDI->delayConnect = this_00;
      QObject::connect((QObject *)&local_f0,(char *)in_RDI->delayConnect,
                       (QObject *)"2activated(QSocketDescriptor)",(char *)pQVar3,0x3ea882);
      QMetaObject::Connection::~Connection(&local_f0);
    }
    if (in_RDI->connectTimer == (QTimer *)0x0) {
      this_01 = (QTimer *)operator_new(0x10);
      QTimer::QTimer(this_01,pQVar3);
      in_RDI->connectTimer = this_01;
      QObject::connect((QObject *)&local_f8,(char *)in_RDI->connectTimer,(QObject *)"2timeout()",
                       (char *)pQVar3,0x3c911c);
      QMetaObject::Connection::~Connection(&local_f8);
      QTimer::start((int)in_RDI->connectTimer);
    }
    QSocketNotifier::setEnabled(SUB81(in_RDI->delayConnect,0));
  }
  else {
    if (iVar8 == 0xd) goto LAB_00388139;
    if (iVar8 == 0x16) {
LAB_00388104:
      setErrorAndEmit(in_stack_fffffffffffffe70,error,
                      (QString *)CONCAT44(iVar8,in_stack_fffffffffffffe60));
    }
    else if (iVar8 == 0x6e) {
      setErrorAndEmit(in_stack_fffffffffffffe70,error,
                      (QString *)CONCAT44(0x6e,in_stack_fffffffffffffe60));
    }
    else {
      if (iVar8 == 0x6f) goto LAB_00388104;
      setErrorAndEmit(in_stack_fffffffffffffe70,error,
                      (QString *)CONCAT44(iVar8,in_stack_fffffffffffffe60));
    }
  }
  QString::~QString((QString *)0x3882d5);
LAB_00388463:
  QByteArray::~QByteArray((QByteArray *)0x388470);
  QString::~QString((QString *)0x38847d);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QLocalSocketPrivate::_q_connectToSocket()
{
    Q_Q(QLocalSocket);

    QLocalSocket::SocketOptions options = optionsForPlatform(socketOptions);
    const QString connectingPathName = pathNameForConnection(connectingName, options);
    const QByteArray encodedConnectingPathName = QFile::encodeName(connectingPathName);
    struct ::sockaddr_un addr;
    addr.sun_family = PF_UNIX;
    memset(addr.sun_path, 0, sizeof(addr.sun_path));

    // for abstract socket add 2 to length, to take into account trailing AND leading null
    constexpr unsigned int extraCharacters = PlatformSupportsAbstractNamespace ? 2 : 1;

    if (sizeof(addr.sun_path) < static_cast<size_t>(encodedConnectingPathName.size() + extraCharacters)) {
        QString function = "QLocalSocket::connectToServer"_L1;
        setErrorAndEmit(QLocalSocket::ServerNotFoundError, function);
        return;
    }

    QT_SOCKLEN_T addrSize = sizeof(::sockaddr_un);
    if (options.testFlag(QLocalSocket::AbstractNamespaceOption)) {
        ::memcpy(addr.sun_path + 1, encodedConnectingPathName.constData(),
                 encodedConnectingPathName.size() + 1);
        addrSize = offsetof(::sockaddr_un, sun_path) + encodedConnectingPathName.size() + 1;
    } else {
        ::memcpy(addr.sun_path, encodedConnectingPathName.constData(),
                 encodedConnectingPathName.size() + 1);
    }
    if (-1 == qt_safe_connect(connectingSocket, (struct sockaddr *)&addr, addrSize)) {
        QString function = "QLocalSocket::connectToServer"_L1;
        switch (errno)
        {
        case EINVAL:
        case ECONNREFUSED:
            setErrorAndEmit(QLocalSocket::ConnectionRefusedError, function);
            break;
        case ENOENT:
            setErrorAndEmit(QLocalSocket::ServerNotFoundError, function);
            break;
        case EACCES:
        case EPERM:
            setErrorAndEmit(QLocalSocket::SocketAccessError, function);
            break;
        case ETIMEDOUT:
            setErrorAndEmit(QLocalSocket::SocketTimeoutError, function);
            break;
        case EAGAIN:
            // Try again later, all of the sockets listening are full
            if (!delayConnect) {
                delayConnect = new QSocketNotifier(connectingSocket, QSocketNotifier::Write, q);
                q->connect(delayConnect, SIGNAL(activated(QSocketDescriptor)), q, SLOT(_q_connectToSocket()));
            }
            if (!connectTimer) {
                connectTimer = new QTimer(q);
                q->connect(connectTimer, SIGNAL(timeout()),
                                 q, SLOT(_q_abortConnectionAttempt()),
                                 Qt::DirectConnection);
                connectTimer->start(QT_CONNECT_TIMEOUT);
            }
            delayConnect->setEnabled(true);
            break;
        default:
            setErrorAndEmit(QLocalSocket::UnknownSocketError, function);
        }
        return;
    }

    // connected!
    cancelDelayedConnect();

    serverName = connectingName;
    fullServerName = connectingPathName;
    if (unixSocket.setSocketDescriptor(connectingSocket,
        QAbstractSocket::ConnectedState, connectingOpenMode)) {
        q->QIODevice::open(connectingOpenMode);
        q->emit connected();
    } else {
        QString function = "QLocalSocket::connectToServer"_L1;
        setErrorAndEmit(QLocalSocket::UnknownSocketError, function);
    }
    connectingSocket = -1;
    connectingName.clear();
    connectingOpenMode = { };
}